

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> *CustomGetSignature)

{
  byte bVar1;
  byte bVar2;
  ShaderResourceCacheVk *pSVar3;
  PipelineResourceSignatureVkImpl *pPRS;
  bool bVar4;
  PipelineResourceSignatureVkImpl *this_00;
  ShaderResourceCacheImplType *in_RCX;
  PipelineResourceSignatureDesc *in_R8;
  PipelineStateVkImpl *pPVar5;
  char (*in_stack_ffffffffffffff78) [81];
  undefined1 local_7c [4];
  string msg;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  
  pPVar5 = (this->m_pPipelineState).m_pObject;
  if (pPVar5 == (PipelineStateVkImpl *)0x0) {
    FormatString<char[31]>(&msg,(char (*) [31])"No PSO is bound in the context");
    in_RCX = (ShaderResourceCacheImplType *)0xa82;
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
               "DvpVerifySRBCompatibility",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa82);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
      operator_delete((undefined1 *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                      msg.field_2._M_allocated_capacity + 1);
    }
    pPVar5 = (this->m_pPipelineState).m_pObject;
  }
  PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
            (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  bVar1 = (pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
  local_7c = (undefined1  [4])0x0;
  if (bVar1 != 0) {
    do {
      if ((CustomGetSignature->super__Function_base)._M_manager == (_Manager_type)0x0) {
        this_00 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                            (&((this->m_pPipelineState).m_pObject)->
                              super_PipelineStateBase<Diligent::EngineVkImplTraits>,(Uint32)local_7c
                            );
      }
      else {
        msg._M_dataplus._M_p._0_4_ = local_7c;
        this_00 = (*CustomGetSignature->_M_invoker)((_Any_data *)CustomGetSignature,(uint *)&msg);
      }
      if ((this_00 != (PipelineResourceSignatureVkImpl *)0x0) &&
         ((this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources != 0)) {
        if (7 < (uint)local_7c) {
          FormatString<char[26],char[31]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"sign < MAX_RESOURCE_SIGNATURES",(char (*) [31])in_RCX);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa8b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
        }
        bVar2 = (this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc.BindingIndex;
        if (local_7c != (undefined1  [4])(uint)bVar2) {
          FormatString<char[26],char[41]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pPSOSign->GetDesc().BindingIndex == sign",
                     (char (*) [41])(ulong)bVar2);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa8c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
        }
        RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
                  ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&pSRB);
        pSVar3 = (Resources->ResourceCaches)._M_elems[(uint)local_7c];
        if (pSVar3 == (ShaderResourceCacheVk *)0x0) {
          if (pSRB.m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
            FormatString<char[100]>
                      (&msg,(char (*) [100])
                            "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug."
                      );
            DebugAssertionFailed
                      ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                       "DvpVerifySRBCompatibility",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                       ,0xa99);
            goto LAB_001bdd9b;
          }
LAB_001bddc1:
          pPVar5 = (this->m_pPipelineState).m_pObject;
          PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                    (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
          in_R8 = (PipelineResourceSignatureDesc *)local_7c;
          FormatString<char[17],char_const*,char[25],unsigned_int,char[81]>
                    (&msg,(Diligent *)"Pipeline state \'",
                     (char (*) [17])
                     &(pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      .m_Desc,(char **)"\' requires SRB at index ",(char (*) [25])in_R8,
                     (uint *)
                     ", but none is bound in the device context. Did you call CommitShaderResources()?"
                     ,in_stack_ffffffffffffff78);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa9d);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
        }
        else if (pSRB.m_pObject == (ShaderResourceBindingVkImpl *)0x0) {
          FormatString<char[40],unsigned_int,char[236]>
                    (&msg,(Diligent *)"Shader resource cache pointer at index ",
                     (char (*) [40])local_7c,
                     (uint *)
                     " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still being used by the context commands. This usage is invalid. A resource must be released only after the last command that uses it."
                     ,(char (*) [236])in_R8);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa95);
LAB_001bdd9b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
          if (pSRB.m_pObject == (ShaderResourceBindingVkImpl *)0x0) goto LAB_001bddc1;
        }
        in_RCX = &((pSRB.m_pObject)->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
                  m_ShaderResourceCache;
        if (pSVar3 != in_RCX) {
          FormatString<char[26],char[36]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pCache == &pSRB->GetResourceCache()",(char (*) [36])in_RCX);
          in_RCX = (ShaderResourceCacheImplType *)0xa9f;
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xa9f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
        }
        pPRS = ((pSRB.m_pObject)->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
               m_pPRS.m_pObject;
        bVar4 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsCompatibleWith
                          (&this_00->
                            super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                           (IPipelineResourceSignature *)pPRS);
        if (!bVar4) {
          pPVar5 = (this->m_pPipelineState).m_pObject;
          PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
                    (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
          in_R8 = &(pPRS->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                   .m_Desc;
          FormatString<char[34],unsigned_int,char[18],char_const*,char[48],char_const*,char[3]>
                    (&msg,(Diligent *)"Shader resource binding at index ",(char (*) [34])local_7c,
                     (uint *)" with signature \'",(char (*) [18])in_R8,
                     (char **)"\' is not compatible with the signature in PSO \'",
                     (char (*) [48])
                     &(pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      .m_Desc,(char **)"\'.",(char (*) [3])in_stack_ffffffffffffff78);
          in_RCX = (ShaderResourceCacheImplType *)0xaa4;
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "DvpVerifySRBCompatibility",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0xaa4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_) != &msg.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                            msg.field_2._M_allocated_capacity + 1);
          }
        }
        RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&pSRB);
      }
      local_7c = (undefined1  [4])((int)local_7c + 1);
    } while ((uint)local_7c < (uint)bVar1);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifySRBCompatibility(
    CommittedShaderResources&                                 Resources,
    std::function<PipelineResourceSignatureImplType*(Uint32)> CustomGetSignature) const
{
    DEV_CHECK_ERR(m_pPipelineState, "No PSO is bound in the context");

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const PipelineResourceSignatureImplType* const pPSOSign = CustomGetSignature ? CustomGetSignature(sign) : m_pPipelineState->GetResourceSignature(sign);
        if (pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0)
            continue; // Skip null and empty signatures

        VERIFY_EXPR(sign < MAX_RESOURCE_SIGNATURES);
        VERIFY_EXPR(pPSOSign->GetDesc().BindingIndex == sign);

        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB   = Resources.SRBs[sign].Lock();
        const ShaderResourceCacheImplType*           pCache = Resources.ResourceCaches[sign];
        if (pCache != nullptr)
        {
            DEV_CHECK_ERR(pSRB, "Shader resource cache pointer at index ", sign,
                          " is non-null, but the corresponding SRB is null. This indicates that the SRB has been released while still "
                          "being used by the context commands. This usage is invalid. A resource must be released only after "
                          "the last command that uses it.");
        }
        else
        {
            VERIFY(!pSRB, "Shader resource cache pointer is null, but SRB is not null. This is unexpected and is likely a bug.");
        }

        DEV_CHECK_ERR(pSRB, "Pipeline state '", m_pPipelineState->GetDesc().Name, "' requires SRB at index ", sign,
                      ", but none is bound in the device context. Did you call CommitShaderResources()?");

        VERIFY_EXPR(pCache == &pSRB->GetResourceCache());

        const PipelineResourceSignatureImplType* const pSRBSign = pSRB->GetSignature();
        DEV_CHECK_ERR(pPSOSign->IsCompatibleWith(pSRBSign), "Shader resource binding at index ", sign, " with signature '",
                      pSRBSign->GetDesc().Name, "' is not compatible with the signature in PSO '",
                      m_pPipelineState->GetDesc().Name, "'.");
    }
}